

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

bool __thiscall soul::AST::EndpointDetails::isResolved(EndpointDetails *this)

{
  size_t sVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  int iVar3;
  Expression *pEVar4;
  long lVar5;
  bool bVar6;
  
  sVar1 = (this->dataTypes).numActive;
  bVar6 = sVar1 == 0;
  if (!bVar6) {
    ppVar2 = (this->dataTypes).items;
    pEVar4 = ppVar2->object;
    if (pEVar4->kind == type) {
      lVar5 = 8;
      do {
        iVar3 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[3])();
        if ((char)iVar3 == '\0') break;
        bVar6 = sVar1 << 3 == lVar5;
        if (bVar6) goto LAB_001ed35c;
        pEVar4 = *(Expression **)((long)&ppVar2->object + lVar5);
        lVar5 = lVar5 + 8;
      } while (pEVar4->kind == type);
    }
    if (!bVar6) {
      return false;
    }
  }
LAB_001ed35c:
  if ((this->arraySize).object == (Expression *)0x0) {
    return true;
  }
  pEVar4 = (this->arraySize).object;
  if (pEVar4 == (Expression *)0x0) {
    return false;
  }
  bVar6 = isResolvedAsConstant(pEVar4);
  return bVar6;
}

Assistant:

bool isResolved() const
        {
            for (auto& t : dataTypes)
                if (! isResolvedAsType (t.get()))
                    return false;

            return arraySize == nullptr || isResolvedAsConstant (arraySize);
        }